

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O3

bool __thiscall
bidirectional::BiDirectional::terminate(BiDirectional *this,Directions *direction,Label *label)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  if ((double)(lVar2 - (this->start_time_).__d.__r) / 1000000000.0 <
      ((this->params_ptr_)._M_t.
       super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>.
       super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->time_limit) {
    bVar1 = checkValidLabel(this,direction,label);
    return bVar1;
  }
  return true;
}

Assistant:

bool BiDirectional::terminate(
    const Directions&       direction,
    const labelling::Label& label) {
  // Check time elapsed (if relevant)
  const double& timediff_sec = getElapsedTime();
  if (!std::isnan(params_ptr_->time_limit) &&
      timediff_sec >= params_ptr_->time_limit) {
    return true;
  }
  return checkValidLabel(direction, label);
}